

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightmapper.h
# Opt level: O1

void lmImageFtoUB(float *image,uchar *outImage,int w,int h,int c,float max)

{
  ulong uVar1;
  uint uVar2;
  float fVar3;
  
  if (0 < c) {
    if ((max == 0.0) && (!NAN(max))) {
      max = lmImageMax(image,w,h,c,0xf);
    }
    uVar2 = h * w * c;
    if (0 < (int)uVar2) {
      uVar1 = 0;
      do {
        fVar3 = image[uVar1] * (255.0 / max);
        if (fVar3 <= 0.0) {
          fVar3 = 0.0;
        }
        if (255.0 <= fVar3) {
          fVar3 = 255.0;
        }
        outImage[uVar1] = (uchar)(int)fVar3;
        uVar1 = uVar1 + 1;
      } while (uVar2 != uVar1);
    }
    return;
  }
  __assert_fail("c > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/lightmapper/lightmapper.h"
                ,0x6af,"void lmImageFtoUB(const float *, unsigned char *, int, int, int, float)");
}

Assistant:

void lmImageFtoUB(const float *image, unsigned char *outImage, int w, int h, int c, float max)
{
	assert(c > 0);
	float scale = 255.0f / (max != 0.0f ? max : lmImageMax(image, w, h, c, LM_ALL_CHANNELS));
	for (int i = 0; i < w * h * c; i++)
		outImage[i] = (unsigned char)lm_minf(lm_maxf(image[i] * scale, 0.0f), 255.0f);
}